

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void compute_max_sb_rows_cols(AV1_COMMON *cm,int *max_sb_rows_in_tile,int *max_sb_cols_in_tile)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int num_sb_cols_in_tile;
  int mi_col_end;
  int mi_col_start;
  int col;
  int *col_start_sb;
  int num_mi_cols;
  int tile_cols;
  int num_sb_rows_in_tile;
  int mi_row_end;
  int mi_row_start;
  int row;
  int *row_start_sb;
  int num_mi_rows;
  int mib_size_log2;
  int tile_rows;
  int *max_sb_cols_in_tile_local;
  int *max_sb_rows_in_tile_local;
  AV1_COMMON *cm_local;
  
  iVar1 = (cm->tiles).rows;
  iVar2 = cm->seq_params->mib_size_log2;
  iVar3 = (cm->mi_params).mi_rows;
  for (row = 0; bVar4 = (byte)iVar2, row < iVar1; row = row + 1) {
    local_64 = iVar3;
    if ((cm->tiles).row_start_sb[row + 1] << (bVar4 & 0x1f) < iVar3) {
      local_64 = (cm->tiles).row_start_sb[row + 1] << (bVar4 & 0x1f);
    }
    local_68 = (local_64 - ((cm->tiles).row_start_sb[row] << (bVar4 & 0x1f))) +
               (1 << (bVar4 & 0x1f)) + -1 >> (bVar4 & 0x1f);
    if (local_68 < *max_sb_rows_in_tile) {
      local_68 = *max_sb_rows_in_tile;
    }
    *max_sb_rows_in_tile = local_68;
  }
  iVar1 = (cm->tiles).cols;
  iVar2 = (cm->mi_params).mi_cols;
  for (col = 0; col < iVar1; col = col + 1) {
    local_6c = iVar2;
    if ((cm->tiles).col_start_sb[col + 1] << (bVar4 & 0x1f) < iVar2) {
      local_6c = (cm->tiles).col_start_sb[col + 1] << (bVar4 & 0x1f);
    }
    local_70 = (local_6c - ((cm->tiles).col_start_sb[col] << (bVar4 & 0x1f))) +
               (1 << (bVar4 & 0x1f)) + -1 >> (bVar4 & 0x1f);
    if (local_70 < *max_sb_cols_in_tile) {
      local_70 = *max_sb_cols_in_tile;
    }
    *max_sb_cols_in_tile = local_70;
  }
  return;
}

Assistant:

static inline void compute_max_sb_rows_cols(const AV1_COMMON *cm,
                                            int *max_sb_rows_in_tile,
                                            int *max_sb_cols_in_tile) {
  const int tile_rows = cm->tiles.rows;
  const int mib_size_log2 = cm->seq_params->mib_size_log2;
  const int num_mi_rows = cm->mi_params.mi_rows;
  const int *const row_start_sb = cm->tiles.row_start_sb;
  for (int row = 0; row < tile_rows; row++) {
    const int mi_row_start = row_start_sb[row] << mib_size_log2;
    const int mi_row_end =
        AOMMIN(row_start_sb[row + 1] << mib_size_log2, num_mi_rows);
    const int num_sb_rows_in_tile =
        CEIL_POWER_OF_TWO(mi_row_end - mi_row_start, mib_size_log2);
    *max_sb_rows_in_tile = AOMMAX(*max_sb_rows_in_tile, num_sb_rows_in_tile);
  }

  const int tile_cols = cm->tiles.cols;
  const int num_mi_cols = cm->mi_params.mi_cols;
  const int *const col_start_sb = cm->tiles.col_start_sb;
  for (int col = 0; col < tile_cols; col++) {
    const int mi_col_start = col_start_sb[col] << mib_size_log2;
    const int mi_col_end =
        AOMMIN(col_start_sb[col + 1] << mib_size_log2, num_mi_cols);
    const int num_sb_cols_in_tile =
        CEIL_POWER_OF_TWO(mi_col_end - mi_col_start, mib_size_log2);
    *max_sb_cols_in_tile = AOMMAX(*max_sb_cols_in_tile, num_sb_cols_in_tile);
  }
}